

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O0

void dumpProfileFab(FArrayBox *fab,string *file)

{
  double *pdVar1;
  bool bVar2;
  BaseFab<double> *pBVar3;
  int iVar4;
  int iVar5;
  IntVect *pIVar6;
  char *pcVar7;
  ostream *poVar8;
  long lVar9;
  long lVar10;
  Long LVar11;
  Box *this;
  BaseFab<double> *in_RDI;
  int n;
  IntVect iv;
  ofstream osf;
  Box pb;
  IntVect iv2;
  IntVect iv1;
  int imid;
  Box *box;
  Long result;
  Box *in_stack_fffffffffffff908;
  Print *in_stack_fffffffffffff910;
  int in_stack_fffffffffffff920;
  int in_stack_fffffffffffff924;
  ostream *in_stack_fffffffffffff938;
  Print *in_stack_fffffffffffff940;
  Print *in_stack_fffffffffffff980;
  int local_648;
  undefined8 local_644;
  int local_63c;
  ostream local_638 [515];
  undefined1 local_435;
  Box local_29c;
  undefined8 local_280;
  int local_278;
  undefined8 local_270;
  int local_268;
  int local_264;
  Box *local_260;
  BaseFab<double> *local_250;
  undefined8 local_248;
  undefined4 local_23c;
  undefined8 *local_238;
  undefined4 local_22c;
  undefined8 *local_228;
  undefined4 local_21c;
  undefined8 *local_218;
  undefined4 local_20c;
  undefined8 *local_208;
  undefined4 local_1fc;
  undefined8 *local_1f8;
  undefined4 local_1ec;
  undefined8 *local_1e8;
  undefined4 local_1dc;
  IntVect *local_1d8;
  undefined4 local_1cc;
  IntVect *local_1c8;
  IntVect *local_1c0;
  undefined8 *local_1b8;
  int local_1ac;
  undefined8 *local_1a8;
  BaseFab<double> *local_1a0;
  undefined8 *local_198;
  Box *local_190;
  undefined4 local_184;
  undefined8 *local_180;
  undefined4 local_174;
  undefined8 *local_170;
  undefined4 local_164;
  undefined8 *local_160;
  undefined4 local_154;
  undefined8 *local_150;
  undefined4 local_144;
  undefined8 *local_140;
  undefined4 local_134;
  undefined8 *local_130;
  undefined4 local_124;
  undefined8 *local_120;
  undefined4 local_114;
  Box *local_110;
  undefined4 local_104;
  IntVect *local_100;
  undefined4 local_f4;
  Box *local_f0;
  undefined4 local_e4;
  IntVect *local_e0;
  undefined8 *local_d8;
  IntVect *local_d0;
  undefined4 local_c4;
  undefined8 *local_c0;
  undefined4 local_b4;
  undefined8 *local_b0;
  undefined4 local_a4;
  undefined8 *local_a0;
  undefined4 local_94;
  undefined8 *local_90;
  undefined4 local_84;
  undefined8 *local_80;
  long local_78;
  undefined8 *local_70;
  Box *local_68;
  undefined4 local_5c;
  Box *local_58;
  undefined4 local_4c;
  undefined8 *local_48;
  undefined4 local_3c;
  Box *local_38;
  undefined4 local_2c;
  undefined8 *local_28;
  undefined4 local_1c;
  Box *local_18;
  undefined4 local_c;
  undefined8 *local_8;
  
  local_250 = in_RDI;
  local_260 = amrex::BaseFab<double>::box(in_RDI);
  local_1c8 = amrex::Box::smallEnd(local_260);
  local_1cc = 0;
  iVar4 = local_1c8->vect[0];
  local_1d8 = amrex::Box::bigEnd(local_260);
  local_1dc = 0;
  local_264 = (int)((double)(iVar4 + local_1d8->vect[0]) * 0.5);
  pIVar6 = amrex::Box::smallEnd(local_260);
  local_268 = pIVar6->vect[2];
  local_270 = *(undefined8 *)pIVar6->vect;
  local_1ec = 0;
  local_1e8 = &local_270;
  pIVar6 = amrex::Box::bigEnd(local_260);
  local_278 = pIVar6->vect[2];
  local_280 = *(undefined8 *)pIVar6->vect;
  local_218 = &local_280;
  local_1fc = 0;
  local_20c = 1;
  local_21c = 1;
  local_208 = &local_270;
  local_1f8 = local_218;
  amrex::Box::Box((Box *)in_stack_fffffffffffff910,&in_stack_fffffffffffff908->smallend,
                  (IntVect *)0x2aaf5f);
  amrex::OutStream();
  amrex::Print::Print(in_stack_fffffffffffff940,in_stack_fffffffffffff938);
  amrex::Print::operator<<(in_stack_fffffffffffff910,(char (*) [14])in_stack_fffffffffffff908);
  amrex::Print::operator<<(in_stack_fffffffffffff910,in_stack_fffffffffffff908);
  local_435 = 10;
  amrex::Print::operator<<(in_stack_fffffffffffff910,(char *)in_stack_fffffffffffff908);
  amrex::Print::~Print(in_stack_fffffffffffff980);
  pcVar7 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_638,pcVar7,_S_out);
  pIVar6 = amrex::Box::smallEnd(&local_29c);
  local_644 = *(undefined8 *)pIVar6->vect;
  local_63c = pIVar6->vect[2];
  while( true ) {
    local_1c0 = amrex::Box::bigEnd(&local_29c);
    local_1b8 = &local_644;
    local_84 = 2;
    bVar2 = true;
    if (local_63c <= local_1c0->vect[2]) {
      local_94 = 2;
      bVar2 = false;
      local_90 = local_1b8;
      if (local_1c0->vect[2] == local_63c) {
        local_a4 = 1;
        bVar2 = true;
        local_a0 = local_1b8;
        if (local_644._4_4_ <= local_1c0->vect[1]) {
          local_b4 = 1;
          bVar2 = false;
          local_b0 = local_1b8;
          if (local_1c0->vect[1] == local_644._4_4_) {
            local_c4 = 0;
            bVar2 = local_1c0->vect[0] < (int)local_644;
            local_c0 = local_1b8;
          }
        }
      }
    }
    local_d8 = local_1b8;
    local_d0 = local_1c0;
    local_80 = local_1b8;
    if (bVar2) break;
    local_228 = &local_644;
    local_22c = 1;
    poVar8 = (ostream *)std::ostream::operator<<(local_638,local_644._4_4_);
    poVar8 = std::operator<<(poVar8," ");
    local_238 = &local_644;
    local_23c = 1;
    poVar8 = (ostream *)
             std::ostream::operator<<(poVar8,((double)local_644._4_4_ + 0.5) * 3.5 * 0.00390625);
    std::operator<<(poVar8," ");
    for (local_648 = 0; iVar4 = amrex::BaseFab<double>::nComp(local_250), pBVar3 = local_250,
        local_648 < iVar4; local_648 = local_648 + 1) {
      local_1a0 = local_250;
      local_1a8 = &local_644;
      local_1ac = local_648;
      pdVar1 = local_250->dptr;
      this = &local_250->domain;
      local_c = 0;
      local_1c = 0;
      local_78 = (long)((int)local_644 - (this->smallend).vect[0]);
      local_70 = local_1a8;
      local_68 = this;
      local_18 = this;
      local_8 = local_1a8;
      iVar4 = amrex::Box::length(this,0);
      local_28 = local_70;
      local_2c = 1;
      local_3c = 1;
      in_stack_fffffffffffff924 = *(int *)((long)local_70 + 4) - (pBVar3->domain).smallend.vect[1];
      local_48 = local_70;
      local_4c = 2;
      local_5c = 2;
      in_stack_fffffffffffff920 = *(int *)(local_70 + 1) - (pBVar3->domain).smallend.vect[2];
      local_58 = this;
      local_38 = this;
      iVar5 = amrex::Box::length(this,1);
      lVar9 = local_78 + iVar4 * (in_stack_fffffffffffff924 + in_stack_fffffffffffff920 * iVar5);
      lVar10 = (long)local_1ac;
      local_78 = lVar9;
      LVar11 = amrex::Box::numPts((Box *)CONCAT44(in_stack_fffffffffffff924,
                                                  in_stack_fffffffffffff920));
      poVar8 = (ostream *)std::ostream::operator<<(local_638,pdVar1[lVar9 + lVar10 * LVar11]);
      std::operator<<(poVar8," ");
    }
    std::operator<<(local_638,'\n');
    local_190 = &local_29c;
    local_198 = &local_644;
    local_124 = 0;
    local_134 = 0;
    local_e0 = &local_29c.bigend;
    local_e4 = 0;
    local_130 = local_198;
    local_120 = local_198;
    if (local_29c.bigend.vect[0] < (int)local_644 + 1) {
      local_f4 = 0;
      local_144 = 0;
      local_154 = 1;
      local_164 = 1;
      local_100 = &local_29c.bigend;
      local_104 = 1;
      local_160 = local_198;
      local_150 = local_198;
      local_140 = local_198;
      local_f0 = local_190;
      if (local_29c.bigend.vect[1] < (int)((ulong)local_644 >> 0x20) + 1) {
        local_114 = 1;
        local_174 = 1;
        local_184 = 2;
        local_180 = local_198;
        local_170 = local_198;
        local_110 = local_190;
      }
    }
  }
  local_248 = 0;
  amrex::Abort_host((char *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
  std::ofstream::~ofstream(local_638);
  return;
}

Assistant:

void dumpProfileFab(const FArrayBox& fab,
                    const std::string& file)
{
  const Box& box = fab.box();
  int imid = (int)(0.5*(box.smallEnd()[0] + box.bigEnd()[0]));
  IntVect iv1 = box.smallEnd(); iv1[0] = imid;
  IntVect iv2 = box.bigEnd(); iv2[0] = imid;
  iv1[1] = 115; iv2[1]=125;
  Box pb(iv1,iv2);
  amrex::Print() << "dumping over " << pb << '\n';

  std::ofstream osf(file.c_str());
  for (IntVect iv = pb.smallEnd(); iv <= pb.bigEnd(); pb.next(iv))
  {
    osf << iv[1] << " " << (iv[1]+0.5)*3.5/256 << " ";
    for (int n=0; n<fab.nComp(); ++n)
      osf << fab(iv,n) << " ";
    osf << '\n';
  }
  amrex::Abort();
}